

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,string_view extension)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_79;
  string file;
  path local_58;
  string_view extension_local;
  
  extension_local._M_len = extension._M_len;
  extension_local._M_str = extension._M_str;
  std::filesystem::__cxx11::path::filename(&local_58,&this->Path);
  std::filesystem::__cxx11::path::string(&file,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  if (file._M_string_length != 0) {
    bVar1 = std::operator!=(&file,".");
    if (bVar1) {
      bVar1 = std::operator!=(&file,"..");
      if (bVar1) {
        uVar2 = std::__cxx11::string::find((char)&file,0x2e);
        if (uVar2 != 0xffffffffffffffff) {
          std::__cxx11::string::erase((ulong)&file,uVar2);
        }
      }
    }
  }
  if (extension._M_len != 0) {
    if (*extension._M_str != '.') {
      std::__cxx11::string::push_back((char)&file);
    }
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_58,&extension_local,&local_79);
    std::__cxx11::string::append((string *)&file);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,&file,auto_format);
  std::filesystem::__cxx11::path::replace_filename(&this->Path);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::__cxx11::string::~string((string *)&file);
  return this;
}

Assistant:

cmCMakePath& cmCMakePath::ReplaceWideExtension(cm::string_view extension)
{
  auto file = this->Path.filename().string();
  if (!file.empty() && file != "." && file != "..") {
    auto pos = file.find('.', file[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      file.erase(pos);
    }
  }
  if (!extension.empty()) {
    if (extension[0] != '.') {
      file += '.';
    }
    file.append(std::string(extension));
  }
  this->Path.replace_filename(file);
  return *this;
}